

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitors.c
# Opt level: O0

void list_modes(GLFWmonitor *monitor)

{
  uint uVar1;
  int iVar2;
  GLFWvidmode *mode_00;
  GLFWvidmode *pGVar3;
  char *pcVar4;
  GLFWmonitor *pGVar5;
  char *pcVar6;
  GLFWvidmode *modes;
  GLFWvidmode *mode;
  int i;
  int heightMM;
  int widthMM;
  int y;
  int x;
  int count;
  GLFWmonitor *monitor_local;
  
  _x = monitor;
  mode_00 = glfwGetVideoMode(monitor);
  pGVar3 = glfwGetVideoModes(_x,&y);
  glfwGetMonitorPos(_x,&widthMM,&heightMM);
  glfwGetMonitorPhysicalSize(_x,&i,(int *)((long)&mode + 4));
  pcVar4 = glfwGetMonitorName(_x);
  pGVar5 = glfwGetPrimaryMonitor();
  pcVar6 = "secondary";
  if (pGVar5 == _x) {
    pcVar6 = "primary";
  }
  printf("Name: %s (%s)\n",pcVar4,pcVar6);
  pcVar4 = format_mode(mode_00);
  printf("Current mode: %s\n",pcVar4);
  printf("Virtual position: %i %i\n",(ulong)(uint)widthMM,(ulong)(uint)heightMM);
  printf("Physical size: %i x %i mm (%0.2f dpi)\n",
         (double)(((float)mode_00->width * 25.4) / (float)i),(ulong)(uint)i,(ulong)mode._4_4_);
  printf("Modes:\n");
  for (mode._0_4_ = 0; uVar1 = (uint)mode, (int)(uint)mode < y; mode._0_4_ = (uint)mode + 1) {
    pcVar4 = format_mode(pGVar3 + (int)(uint)mode);
    printf("%3u: %s",(ulong)uVar1,pcVar4);
    iVar2 = memcmp(mode_00,pGVar3 + (int)(uint)mode,0x18);
    if (iVar2 == 0) {
      printf(" (current mode)");
    }
    putchar(10);
  }
  return;
}

Assistant:

static void list_modes(GLFWmonitor* monitor)
{
    int count, x, y, widthMM, heightMM, i;
    const GLFWvidmode* mode = glfwGetVideoMode(monitor);
    const GLFWvidmode* modes = glfwGetVideoModes(monitor, &count);

    glfwGetMonitorPos(monitor, &x, &y);
    glfwGetMonitorPhysicalSize(monitor, &widthMM, &heightMM);

    printf("Name: %s (%s)\n",
           glfwGetMonitorName(monitor),
           glfwGetPrimaryMonitor() == monitor ? "primary" : "secondary");
    printf("Current mode: %s\n", format_mode(mode));
    printf("Virtual position: %i %i\n", x, y);

    printf("Physical size: %i x %i mm (%0.2f dpi)\n",
           widthMM, heightMM, mode->width * 25.4f / widthMM);

    printf("Modes:\n");

    for (i = 0;  i < count;  i++)
    {
        printf("%3u: %s", (unsigned int) i, format_mode(modes + i));

        if (memcmp(mode, modes + i, sizeof(GLFWvidmode)) == 0)
            printf(" (current mode)");

        putchar('\n');
    }
}